

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arena_i_dss_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                   size_t newlen)

{
  char *__s2;
  arena_t *arena;
  _Bool _Var1;
  int iVar2;
  dss_prec_t dVar3;
  ulong uVar4;
  int i;
  long lVar5;
  size_t __n;
  char *dss;
  char *local_38;
  
  local_38 = (char *)0x0;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    uVar4 = mib[1];
    lVar5 = 3;
    iVar2 = 0xe;
    if (uVar4 >> 0x20 != 0) goto LAB_01d5c6b6;
LAB_01d5c5fb:
    dVar3 = (dss_prec_t)lVar5;
    if ((uVar4 == 0x1000) || (ctl_arenas->narenas == (uint)uVar4)) {
      if (dVar3 != dss_prec_limit) {
        _Var1 = duckdb_je_extent_dss_prec_set(dVar3);
        iVar2 = 0xe;
        if (_Var1) goto LAB_01d5c6b6;
      }
      dVar3 = duckdb_je_extent_dss_prec_get();
    }
    else {
      arena = (arena_t *)duckdb_je_arenas[uVar4].repr;
      iVar2 = 0xe;
      if ((arena == (arena_t *)0x0) ||
         ((dVar3 != dss_prec_limit && (_Var1 = duckdb_je_arena_dss_prec_set(arena,dVar3), _Var1))))
      goto LAB_01d5c6b6;
      dVar3 = duckdb_je_arena_dss_prec_get(arena);
    }
    local_38 = duckdb_je_dss_prec_names[dVar3];
    iVar2 = 0;
    if (oldlenp == (size_t *)0x0 || oldp == (void *)0x0) goto LAB_01d5c6b6;
    uVar4 = *oldlenp;
    if (uVar4 == 8) {
      *(char **)oldp = local_38;
      goto LAB_01d5c6b6;
    }
    __n = 8;
    if (uVar4 < 8) {
      __n = uVar4;
    }
    switchD_012b9b0d::default(oldp,&local_38,__n);
    *oldlenp = __n;
  }
  else if (newlen == 8) {
    __s2 = *newp;
    uVar4 = mib[1];
    iVar2 = 0xe;
    local_38 = __s2;
    if (uVar4 >> 0x20 != 0) goto LAB_01d5c6b6;
    if (__s2 == (char *)0x0) {
      lVar5 = 3;
      goto LAB_01d5c5fb;
    }
    lVar5 = 0;
    do {
      iVar2 = strcmp(duckdb_je_dss_prec_names[lVar5],__s2);
      if (iVar2 == 0) goto LAB_01d5c5fb;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  iVar2 = 0x16;
LAB_01d5c6b6:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
arena_i_dss_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const char *dss = NULL;
	unsigned arena_ind;
	dss_prec_t dss_prec = dss_prec_limit;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(dss, const char *);
	MIB_UNSIGNED(arena_ind, 1);
	if (dss != NULL) {
		int i;
		bool match = false;

		for (i = 0; i < dss_prec_limit; i++) {
			if (strcmp(dss_prec_names[i], dss) == 0) {
				dss_prec = i;
				match = true;
				break;
			}
		}

		if (!match) {
			ret = EINVAL;
			goto label_return;
		}
	}

	/*
	 * Access via index narenas is deprecated, and scheduled for removal in
	 * 6.0.0.
	 */
	dss_prec_t dss_prec_old;
	if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind ==
	    ctl_arenas->narenas) {
		if (dss_prec != dss_prec_limit &&
		    extent_dss_prec_set(dss_prec)) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = extent_dss_prec_get();
	} else {
		arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL || (dss_prec != dss_prec_limit &&
		    arena_dss_prec_set(arena, dss_prec))) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = arena_dss_prec_get(arena);
	}

	dss = dss_prec_names[dss_prec_old];
	READ(dss, const char *);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}